

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O3

void __thiscall
cxxopts::missing_argument_exception::~missing_argument_exception(missing_argument_exception *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)&(this->super_OptionParseException).super_OptionException =
       &PTR__OptionException_001a62b8;
  pcVar2 = (this->super_OptionParseException).super_OptionException.m_message._M_dataplus._M_p;
  paVar1 = &(this->super_OptionParseException).super_OptionException.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::exception::~exception((exception *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

missing_argument_exception(const std::string& option)
    : OptionParseException(
        "Option " + LQUOTE + option + RQUOTE + " is missing an argument"
      )
    {
    }